

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynet.h
# Opt level: O0

VariableIndex __thiscall
dynet::ComputationGraph::
add_function<dynet::PickNegLogSoftmax,std::vector<unsigned_int,std::allocator<unsigned_int>>const&>
          (ComputationGraph *this,initializer_list<dynet::VariableIndex> *arguments,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *side_information)

{
  size_type sVar1;
  initializer_list<dynet::VariableIndex> *a;
  vector<dynet::Node_*,_std::allocator<dynet::Node_*>_> *in_RSI;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RDI;
  VariableIndex *new_node_index;
  uint uVar2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *v;
  PickNegLogSoftmax *in_stack_ffffffffffffffc0;
  uint local_24 [9];
  
  v = in_RDI;
  sVar1 = std::vector<dynet::Node_*,_std::allocator<dynet::Node_*>_>::size(in_RSI);
  local_24[0] = (uint)sVar1;
  VariableIndex::VariableIndex((VariableIndex *)v,local_24);
  a = (initializer_list<dynet::VariableIndex> *)operator_new(0x88);
  PickNegLogSoftmax::PickNegLogSoftmax(in_stack_ffffffffffffffc0,a,v);
  std::vector<dynet::Node_*,_std::allocator<dynet::Node_*>_>::push_back(in_RSI,(value_type *)in_RDI)
  ;
  uVar2 = (uint)in_RDI;
  set_dim_for_new_node((ComputationGraph *)arguments,(VariableIndex *)side_information);
  return (VariableIndex)uVar2;
}

Assistant:

inline VariableIndex ComputationGraph::add_function(const std::initializer_list<VariableIndex>& arguments,
                                              Args&&... side_information) {
  VariableIndex new_node_index(nodes.size());
  nodes.push_back(new Function(arguments, std::forward<Args>(side_information)...));
  set_dim_for_new_node(new_node_index);
  return new_node_index;
}